

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hh
# Opt level: O3

bool __thiscall
tchecker::
cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
::operator==(cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
             *this,cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
                   *it)

{
  pointer peVar1;
  pointer peVar2;
  pointer peVar3;
  pointer peVar4;
  bool bVar5;
  
  if (this->_nranges == it->_nranges) {
    peVar2 = (this->_begins).
             super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar1 = (this->_begins).
             super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    peVar3 = (it->_begins).
             super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)peVar1 - (long)peVar2 ==
        (long)(it->_begins).
              super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)peVar3) {
      for (; peVar2 != peVar1; peVar2 = peVar2 + 1) {
        if ((peVar2->super_const_iterator)._M_current != (peVar3->super_const_iterator)._M_current)
        {
          return false;
        }
        peVar3 = peVar3 + 1;
      }
      peVar2 = (this->_ends).
               super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
               ._M_impl.super__Vector_impl_data._M_start;
      peVar1 = (this->_ends).
               super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      peVar3 = (it->_ends).
               super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)peVar1 - (long)peVar2 ==
          (long)(it->_ends).
                super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)peVar3) {
        for (; peVar2 != peVar1; peVar2 = peVar2 + 1) {
          if ((peVar2->super_const_iterator)._M_current != (peVar3->super_const_iterator)._M_current
             ) {
            return false;
          }
          peVar3 = peVar3 + 1;
        }
        peVar2 = (this->_its).
                 super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        peVar1 = (this->_its).
                 super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        peVar3 = (it->_its).
                 super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)peVar1 - (long)peVar2 ==
            (long)(it->_its).
                  super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)peVar3) {
          if (peVar2 == peVar1) {
            return true;
          }
          do {
            peVar4 = peVar2 + 1;
            bVar5 = (peVar2->super_const_iterator)._M_current ==
                    (peVar3->super_const_iterator)._M_current;
            if (!bVar5) {
              return bVar5;
            }
            peVar3 = peVar3 + 1;
            peVar2 = peVar4;
          } while (peVar4 != peVar1);
          return bVar5;
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator==(tchecker::cartesian_iterator_t<R> const & it) const
  {
    return ((_nranges == it._nranges) && (_begins == it._begins) && (_ends == it._ends) && (_its == it._its));
  }